

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::getTestCaseName_abi_cxx11_
          (string *__return_storage_ptr__,XFBExceedOffsetLimitTest *this,GLuint test_case_index)

{
  pointer ptVar1;
  ostream *poVar2;
  GLchar *pGVar3;
  ulong uVar4;
  TestError *this_00;
  stringstream stream;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&stream);
  ptVar1 = (this->m_test_cases).
           super__Vector_base<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::XFBExceedOffsetLimitTest::testCase>_>
           ._M_impl.super__Vector_impl_data._M_start;
  poVar2 = std::operator<<(&local_1a8,"Stage: ");
  pGVar3 = Utils::Shader::GetStageName(ptVar1[test_case_index].m_stage);
  poVar2 = std::operator<<(poVar2,pGVar3);
  std::operator<<(poVar2,", case: ");
  uVar4 = (ulong)ptVar1[test_case_index].m_case;
  if (uVar4 < 3) {
    std::operator<<(&local_1a8,*(char **)(&DAT_01dc06f8 + uVar4 * 8));
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&stream);
    return __return_storage_ptr__;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0x5d93);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

std::string XFBExceedOffsetLimitTest::getTestCaseName(GLuint test_case_index)
{
	std::stringstream stream;
	testCase&		  test_case = m_test_cases[test_case_index];

	stream << "Stage: " << Utils::Shader::GetStageName(test_case.m_stage) << ", case: ";

	switch (test_case.m_case)
	{
	case BLOCK:
		stream << "BLOCK";
		break;
	case GLOBAL:
		stream << "GLOBAL";
		break;
	case VECTOR:
		stream << "VECTOR";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return stream.str();
}